

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall GlobOpt::ValueNumberLdElemDst(GlobOpt *this,Instr **pInstr,Value *srcVal)

{
  Opnd *this_00;
  IndirOpnd *indirOpnd;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  ObjectType OVar5;
  uint uVar6;
  uint uVar7;
  int32 newMax;
  BailOutKind BVar8;
  undefined4 *puVar9;
  JITTimeFunctionBody *pJVar10;
  FunctionJITTimeInfo *pFVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  Value *pVVar15;
  undefined4 uVar16;
  char *in_RCX;
  Instr *pIVar17;
  char16_t *pcVar18;
  ValueInfo *pVVar19;
  undefined8 uVar20;
  BailOutKind bailOutKind;
  wchar local_2b8 [4];
  char16 debugStringBuffer [42];
  wchar local_1b8 [4];
  char16 debugStringBuffer_1 [42];
  char local_158 [8];
  char baseValueTypeStr [256];
  Value *local_40;
  Value *dstVal;
  ValueType profiledElementType;
  ValueType baseValueType;
  
  this_00 = (*pInstr)->m_dst;
  local_40 = (Value *)0x0;
  if (srcVal == (Value *)0x0) {
    pVVar19 = (ValueInfo *)0x0;
  }
  else {
    pVVar19 = srcVal->valueInfo;
  }
  ValueType::ValueType((ValueType *)((long)&dstVal + 4));
  if ((*pInstr)->m_kind == InstrKindProfiled) {
    dstVal._4_2_ = (anon_union_2_4_ea848c7b_for_ValueType_13)
                   *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                    &((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     ((long)(*pInstr)[1]._vptr_Instr + 2))->field_0;
    bVar2 = ValueType::IsLikelyInt((ValueType *)((long)&dstVal + 4));
    if ((bVar2) && (OVar3 = IR::Opnd::GetKind(this_00), OVar3 == OpndKindReg)) {
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        in_RCX = "Bad call to AsRegOpnd()";
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) goto LAB_0045b032;
        *puVar9 = 0;
      }
      if ((srcVal != (Value *)0x0) && (((ulong)this_00[1]._vptr_Opnd[3] & 2) == 0)) {
LAB_0045a502:
        bVar2 = ValueType::IsUninitialized(&pVVar19->super_ValueType);
        if (bVar2) {
          if (this->prePassLoop == (Loop *)0x0) {
            (pVVar19->super_ValueType).field_0.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 dstVal._4_2_;
            IR::Opnd::SetValueType((*pInstr)->m_src1,(ValueType)dstVal._4_2_);
          }
          else {
            local_40 = NewGenericValue(this,(ValueType)dstVal._4_2_,this_00);
          }
        }
      }
    }
    else if (srcVal != (Value *)0x0) goto LAB_0045a502;
  }
  indirOpnd = (IndirOpnd *)(*pInstr)->m_src1;
  OVar3 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    in_RCX = "Bad call to AsIndirOpnd()";
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) goto LAB_0045b032;
    *puVar9 = 0;
  }
  dstVal._6_2_ = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
  if ((((bVar2) ||
       ((bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)((long)&dstVal + 6)), !bVar2 &&
        ((bVar2 = ValueType::IsLikelyNativeArray((ValueType *)((long)&dstVal + 6)), !bVar2 ||
         ((*pInstr)->m_kind != InstrKindProfiled)))))) ||
      ((bVar2 = DoTypedArrayTypeSpec(this->func), !bVar2 &&
       (bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)((long)&dstVal + 6)), bVar2))))
     || (((bVar2 = DoNativeArrayTypeSpec(this->func), !bVar2 &&
          (bVar2 = ValueType::IsLikelyNativeArray((ValueType *)((long)&dstVal + 6)), bVar2)) ||
         (bVar2 = ShouldExpectConventionalArrayIndexValue(this,indirOpnd), !bVar2)))) {
    bVar2 = DoTypedArrayTypeSpec(this->func);
    if ((bVar2) && (this->prePassLoop == (Loop *)0x0)) {
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar6,uVar7);
      if (bVar2) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Didn\'t specialize array access.\n");
        IR::Instr::Dump(*pInstr);
        Output::Flush();
      }
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar6,uVar7);
      if (bVar2) {
        ValueType::ToString((ValueType *)((long)&dstVal + 6),(char (*) [256])local_158);
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_2b8);
        pcVar14 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
        bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
        if (bVar2) {
          pcVar18 = L"instruction uses the arguments object";
        }
        else {
          bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)((long)&dstVal + 6));
          pcVar18 = L"of array type";
          if (bVar2) {
            pcVar18 = L"index is negative or likely not int";
          }
        }
        Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"
                      ,pcVar12,pcVar13,pcVar14,local_158,pcVar18);
        Output::Flush();
      }
    }
    goto LAB_0045aa5e;
  }
  OVar3 = IR::Opnd::GetKind((*pInstr)->m_src1);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    in_RCX = "instr->GetSrc1()->IsIndirOpnd()";
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1521,"(instr->GetSrc1()->IsIndirOpnd())","instr->GetSrc1()->IsIndirOpnd()"
                      );
    if (!bVar2) goto LAB_0045b032;
    *puVar9 = 0;
  }
  OVar5 = ValueType::GetObjectType((ValueType *)((long)&dstVal + 6));
  bailOutKind = BailOutConventionalTypedArrayAccessOnly;
  switch(OVar5) {
  case Int8Array:
  case Int8VirtualArray:
  case Int8MixedArray:
    uVar20._0_1_ = -0x80;
    uVar20._1_1_ = -1;
    uVar20._2_1_ = -1;
    uVar20._3_1_ = -1;
    uVar20._4_1_ = '\0';
    uVar20._5_1_ = '\0';
    uVar20._6_1_ = '\0';
    uVar20._7_1_ = '\0';
    newMax = 0x7f;
    break;
  case Uint8Array:
  case Uint8ClampedArray:
  case Uint8VirtualArray:
  case Uint8ClampedVirtualArray:
  case Uint8MixedArray:
  case Uint8ClampedMixedArray:
    uVar20._0_1_ = '\0';
    uVar20._1_1_ = '\0';
    uVar20._2_1_ = '\0';
    uVar20._3_1_ = '\0';
    uVar20._4_1_ = '\0';
    uVar20._5_1_ = '\0';
    uVar20._6_1_ = '\0';
    uVar20._7_1_ = '\0';
    newMax = 0xff;
    break;
  case Int16Array:
  case Int16VirtualArray:
  case Int16MixedArray:
    uVar20._0_1_ = '\0';
    uVar20._1_1_ = -0x80;
    uVar20._2_1_ = -1;
    uVar20._3_1_ = -1;
    uVar20._4_1_ = '\0';
    uVar20._5_1_ = '\0';
    uVar20._6_1_ = '\0';
    uVar20._7_1_ = '\0';
    newMax = 0x7fff;
    break;
  case Uint16Array:
  case Uint16VirtualArray:
  case Uint16MixedArray:
    uVar20._0_1_ = '\0';
    uVar20._1_1_ = '\0';
    uVar20._2_1_ = '\0';
    uVar20._3_1_ = '\0';
    uVar20._4_1_ = '\0';
    uVar20._5_1_ = '\0';
    uVar20._6_1_ = '\0';
    uVar20._7_1_ = '\0';
    newMax = 0xffff;
    break;
  case Int32Array:
  case Uint32Array:
  case Int32VirtualArray:
  case Uint32VirtualArray:
  case Int32MixedArray:
  case Uint32MixedArray:
    uVar20._0_1_ = '\0';
    uVar20._1_1_ = '\0';
    uVar20._2_1_ = '\0';
    uVar20._3_1_ = -0x80;
    uVar20._4_1_ = '\0';
    uVar20._5_1_ = '\0';
    uVar20._6_1_ = '\0';
    uVar20._7_1_ = '\0';
    newMax = 0x7fffffff;
    break;
  case Float32Array:
  case Float64Array:
  case Float32VirtualArray:
  case Float64VirtualArray:
  case Float32MixedArray:
  case Float64MixedArray:
    bVar2 = true;
    baseValueTypeStr._248_8_ = baseValueTypeStr._248_8_ & 0xffffffff00000000;
LAB_0045a8f2:
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1592,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
      if (!bVar4) goto LAB_0045b032;
      *puVar9 = 0;
    }
    if ((this->field_0xf5 & 0x20) != 0) {
      if (this->prePassLoop == (Loop *)0x0) {
        if (((*pInstr)->field_0x38 & 0x10) == 0) {
          GenerateBailAtOperation(this,pInstr,bailOutKind);
        }
        else {
          BVar8 = IR::Instr::GetBailOutKind(*pInstr);
          if ((((BVar8 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
              ((BVar8 & ~BailOutKindBits) != BailOutInvalid)) ||
             ((BVar8 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                        BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                        BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                        BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                       BailOutOnResultConditions)) != BailOutInvalid)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x15af,
                               "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                               ,
                               "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                              );
            if (!bVar4) goto LAB_0045b032;
            *puVar9 = 0;
          }
          if (bVar2) {
            pIVar17 = *pInstr;
            BVar8 = BVar8 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                             BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                             BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                             BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                            BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
          }
          else {
            if (baseValueTypeStr[0xf8] == '\0') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar9 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x15bc,
                                 "(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                                 "bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
              if (!bVar2) goto LAB_0045b032;
              *puVar9 = 0;
            }
            pIVar17 = *pInstr;
            BVar8 = BVar8 | bailOutKind;
          }
          IR::Instr::SetBailOutKind(pIVar17,BVar8);
        }
      }
      TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,(Value *)0x0,(Value *)0x0,&local_40);
      pcVar18 = L"float64";
      goto LAB_0045ac8f;
    }
    goto LAB_0045aa5e;
  default:
    bVar2 = ValueType::IsLikelyNativeArray((ValueType *)((long)&dstVal + 6));
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      in_RCX = "baseValueType.IsLikelyNativeArray()";
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x15ca,"(baseValueType.IsLikelyNativeArray())",
                         "baseValueType.IsLikelyNativeArray()");
      if (!bVar2) goto LAB_0045b032;
      *puVar9 = 0;
    }
    bVar2 = ValueType::HasIntElements((ValueType *)((long)&dstVal + 6));
    if (!bVar2) {
      bVar2 = ValueType::HasFloatElements((ValueType *)((long)&dstVal + 6));
      bailOutKind = BailOutConventionalNativeArrayAccessOnly;
      uVar16 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
      baseValueTypeStr[0xf8] = (char)uVar16;
      baseValueTypeStr[0xf9] = (char)((uint)uVar16 >> 8);
      baseValueTypeStr[0xfa] = (char)((uint)uVar16 >> 0x10);
      baseValueTypeStr[0xfb] = (char)((uint)uVar16 >> 0x18);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x15d0,"(baseValueType.HasFloatElements())",
                           "baseValueType.HasFloatElements()");
        if (!bVar2) goto LAB_0045b032;
        *puVar9 = 0;
        bVar2 = false;
        bailOutKind = BailOutConventionalNativeArrayAccessOnly;
      }
      goto LAB_0045a8f2;
    }
    uVar20._0_1_ = '\0';
    uVar20._1_1_ = '\0';
    uVar20._2_1_ = '\0';
    uVar20._3_1_ = -0x80;
    uVar20._4_1_ = '\0';
    uVar20._5_1_ = '\0';
    uVar20._6_1_ = '\0';
    uVar20._7_1_ = '\0';
    newMax = 0x7fffffff;
    bailOutKind = BailOutConventionalNativeArrayAccessOnly;
  }
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    baseValueTypeStr._248_8_ = uVar20;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1553,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar2) goto LAB_0045b032;
    *puVar9 = 0;
    uVar20 = baseValueTypeStr._248_8_;
  }
  if ((this->field_0xf5 & 0x22) == 0) {
LAB_0045aa5e:
    pVVar15 = local_40;
    if (local_40 == (Value *)0x0) {
      if (srcVal == (Value *)0x0) {
        pVVar15 = NewGenericValue(this,(ValueType)dstVal._4_2_,this_00);
      }
      else {
        pVVar15 = srcVal;
        if (this->prePassLoop != (Loop *)0x0) {
          pVVar15 = ValueNumberTransferDstInPrepass(this,*pInstr,srcVal);
        }
      }
    }
    local_40 = pVVar15;
    return local_40;
  }
  if (this->prePassLoop == (Loop *)0x0) {
    if (((*pInstr)->field_0x38 & 0x10) == 0) {
      GenerateBailAtOperation(this,pInstr,bailOutKind);
    }
    else {
      BVar8 = IR::Instr::GetBailOutKind(*pInstr);
      baseValueTypeStr._248_8_ = uVar20;
      if ((((BVar8 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
          ((BVar8 & ~BailOutKindBits) != BailOutInvalid)) ||
         ((BVar8 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                    BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                    BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                    BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                   BailOutOnResultConditions)) != BailOutInvalid)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1571,
                           "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                           ,
                           "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                          );
        if (!bVar2) goto LAB_0045b032;
        *puVar9 = 0;
      }
      if (bailOutKind == BailOutConventionalNativeArrayAccessOnly) {
LAB_0045ac4d:
        pIVar17 = *pInstr;
        BVar8 = BVar8 | bailOutKind;
      }
      else {
        if (bailOutKind != BailOutConventionalTypedArrayAccessOnly) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x157e,"(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)"
                             ,"bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
          if (!bVar2) {
LAB_0045b032:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar9 = 0;
          goto LAB_0045ac4d;
        }
        pIVar17 = *pInstr;
        BVar8 = BVar8 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                         BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                         BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                         BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                        BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
      }
      uVar20 = baseValueTypeStr._248_8_;
      IR::Instr::SetBailOutKind(pIVar17,BVar8);
    }
  }
  TypeSpecializeIntDst
            (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,(Value *)0x0,(Value *)0x0,bailOutKind,
             (int32)uVar20,newMax,&local_40,(AddSubConstantInfo *)0x0);
  pcVar18 = L"int32";
LAB_0045ac8f:
  if (local_40 == (Value *)0x0) {
    local_40 = NewGenericValue(this,(ValueType)dstVal._4_2_,this_00);
  }
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar6,uVar7);
  if (bVar2) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized array access.\n");
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar6,uVar7);
  if (!bVar2) {
    return local_40;
  }
  ValueType::ToString((ValueType *)((long)&dstVal + 6),(char (*) [256])local_158);
  pVVar15 = local_40;
  ValueType::ToString(&local_40->valueInfo->super_ValueType,(char (*) [256])local_2b8);
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_1b8);
  pcVar14 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
  Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"
                ,pcVar12,pcVar13,pcVar14,local_158,pcVar18,local_2b8);
  Output::Print(L" (");
  ::Value::Dump(pVVar15);
  Output::Print(L").\n");
  Output::Flush();
  return local_40;
}

Assistant:

Value *
GlobOpt::ValueNumberLdElemDst(IR::Instr **pInstr, Value *srcVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    int32 newMin, newMax;
    ValueInfo *srcValueInfo = (srcVal ? srcVal->GetValueInfo() : nullptr);

    ValueType profiledElementType;
    if (instr->IsProfiledInstr())
    {
        profiledElementType = instr->AsProfiledInstr()->u.ldElemInfo->GetElementType();
        if(!(profiledElementType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) &&
            srcVal &&
            srcValueInfo->IsUninitialized())
        {
            if(IsLoopPrePass())
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
            else
            {
                // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                // can improve the original value type.
                srcValueInfo->Type() = profiledElementType;
                instr->GetSrc1()->SetValueType(profiledElementType);
            }
        }
    }
    
    IR::IndirOpnd *src = instr->GetSrc1()->AsIndirOpnd();
    const ValueType baseValueType(src->GetBaseOpnd()->GetValueType());
    if (instr->DoStackArgsOpt() ||
        !(
            baseValueType.IsLikelyOptimizedTypedArray() ||
            (baseValueType.IsLikelyNativeArray() && instr->IsProfiledInstr()) // Specialized native array lowering for LdElem requires that it is profiled.
        ) ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||

        // Don't do type spec on native array with a history of accessing gaps, as this is a bailout
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !ShouldExpectConventionalArrayIndexValue(src))
    {
        if(DoTypedArrayTypeSpec() && !IsLoopPrePass())
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"),
                    this->func->GetJITFunctionBody()->GetDisplayName(),
                    this->func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                    baseValueTypeStr,
                    instr->DoStackArgsOpt() ? _u("instruction uses the arguments object") :
                    baseValueType.IsLikelyOptimizedTypedArray() ? _u("index is negative or likely not int") : _u("of array type"));
                Output::Flush();
            }
        }

        if(!dstVal)
        {
            if(srcVal)
            {
                dstVal = this->ValueNumberTransferDst(instr, srcVal);
            }
            else
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
        }
        return dstVal;
    }

    Assert(instr->GetSrc1()->IsIndirOpnd());

    IRType toType = TyVar;
    IR::BailOutKind bailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Int8MixedArray:
        newMin = Int8ConstMin;
        newMax = Int8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint8Array:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        newMin = Uint8ConstMin;
        newMax = Uint8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int16Array:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Int16MixedArray:
        newMin = Int16ConstMin;
        newMax = Int16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint16Array:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Uint16MixedArray:
        newMin = Uint16ConstMin;
        newMax = Uint16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int32Array:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int32MixedArray:
    case ObjectType::Uint32Array: // int-specialized loads from uint32 arrays will bail out on values that don't fit in an int32
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
    Int32Array:
        newMin = Int32ConstMin;
        newMax = Int32ConstMax;
        goto IntArrayCommon;

    IntArrayCommon:
        Assert(dst->IsRegOpnd());

        // If int type spec is disabled, it is ok to load int values as they can help float type spec, and merging int32 with float64 => float64.
        // But if float type spec is also disabled, we'll have problems because float64 merged with var => float64...
        if (!this->DoAggressiveIntTypeSpec() && !this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, bailOutKind, newMin, newMax, &dstVal);
        toType = TyInt32;
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64Array:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
        Assert(dst->IsRegOpnd());

        // If float type spec is disabled, don't load float64 values
        if (!this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, &dstVal);
        toType = TyFloat64;
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        bailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if(!dstVal)
    {
        dstVal = NewGenericValue(profiledElementType, dst);
    }

    Assert(toType != TyVar);

    GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
    if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        baseValueType.ToString(baseValueTypeStr);
        char dstValTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        dstVal->GetValueInfo()->Type().ToString(dstValTypeStr);
        Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"),
            this->func->GetJITFunctionBody()->GetDisplayName(),
            this->func->GetDebugNumberSet(debugStringBuffer),
            Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
            baseValueTypeStr,
            toType == TyInt32 ? _u("int32") : _u("float64"),
            dstValTypeStr);
#if DBG_DUMP
        Output::Print(_u(" ("));
        dstVal->Dump();
        Output::Print(_u(").\n"));
#else
        Output::Print(_u(".\n"));
#endif
        Output::Flush();
    }

    return dstVal;
}